

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

int Tas_ManSolve_rec(Tas_Man_t *p,int Level)

{
  Tas_Que_t *p_00;
  int *piVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Gia_Obj_t **ppGVar10;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  int iVar13;
  Gia_Obj_t *pObjMax;
  int i_1;
  long lVar14;
  int i;
  long lVar15;
  Gia_Obj_t *pGVar16;
  bool bVar17;
  float fVar18;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Tas_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                  ,0x50c,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
  }
  iVar6 = Tas_ManPropagate(p,Level);
  if (iVar6 == 0) {
    iVar9 = (p->pProp).iHead;
    if (iVar9 != (p->pProp).iTail) {
      __assert_fail("Tas_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                    ,0x513,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
    }
    iVar3 = (p->pJust).iHead;
    iVar4 = (p->pJust).iTail;
    iVar7 = iVar4 - iVar3;
    iVar6 = 0;
    if (iVar7 != 0) {
      iVar13 = (p->Pars).nJustThis;
      if (iVar7 < iVar13) {
        iVar7 = iVar13;
      }
      (p->Pars).nJustThis = iVar7;
      iVar7 = Tas_ManCheckLimits(p);
      if (iVar7 == 0) {
        lVar14 = (long)iVar4;
        for (lVar15 = (long)iVar3; lVar15 < lVar14; lVar15 = lVar15 + 1) {
          Tas_QuePush(&p->pJust,(p->pJust).pData[lVar15]);
        }
        (p->pJust).iHead = iVar4;
        if ((p->Pars).fUseActive == 0) {
          if ((p->Pars).fUseHighest == 0) {
            if ((p->Pars).fUseLowest == 0) {
              if ((p->Pars).fUseMaxFF == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                              ,0x527,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
              }
              if (p->pAig->pRefs == (int *)0x0) {
                __assert_fail("p->pAig->pRefs != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                              ,600,"Gia_Obj_t *Tas_ManDecideMaxFF(Tas_Man_t *)");
              }
              pGVar16 = (Gia_Obj_t *)0x0;
              iVar6 = 0;
              for (; (lVar14 < (p->pJust).iTail &&
                     (pGVar5 = (p->pJust).pData[lVar14], pGVar5 != (Gia_Obj_t *)0x0));
                  lVar14 = lVar14 + 1) {
                if (((ulong)pGVar5 & 1) != 0) {
                  __assert_fail("!Gia_IsComplement(pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                                ,0x1ba,"int Tas_VarFaninFanoutMax(Tas_Man_t *, Gia_Obj_t *)");
                }
                if (((int)(uint)*(undefined8 *)pGVar5 < 0) ||
                   (uVar8 = (uint)*(undefined8 *)pGVar5 & 0x1fffffff, uVar8 == 0x1fffffff)) {
                  __assert_fail("Gia_ObjIsAnd(pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                                ,0x1bb,"int Tas_VarFaninFanoutMax(Tas_Man_t *, Gia_Obj_t *)");
                }
                iVar13 = Gia_ObjRefNum(p->pAig,pGVar5 + -(ulong)uVar8);
                iVar7 = Gia_ObjRefNum(p->pAig,pGVar5 + -(ulong)(*(uint *)&pGVar5->field_0x4 &
                                                               0x1fffffff));
                if (iVar7 < iVar13) {
                  iVar7 = iVar13;
                }
                if (iVar7 < 1) {
                  __assert_fail("iCurFF > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                                ,0x25c,"Gia_Obj_t *Tas_ManDecideMaxFF(Tas_Man_t *)");
                }
                iVar13 = iVar6;
                if (iVar6 <= iVar7) {
                  iVar13 = iVar7;
                }
                if (iVar6 < iVar7) {
                  pGVar16 = pGVar5;
                }
                iVar6 = iVar13;
              }
            }
            else {
              pGVar16 = (Gia_Obj_t *)0x0;
              for (; (lVar14 < (p->pJust).iTail &&
                     (pGVar5 = (p->pJust).pData[lVar14], pGVar5 != (Gia_Obj_t *)0x0));
                  lVar14 = lVar14 + 1) {
                pGVar12 = pGVar16;
                if (pGVar5 < pGVar16) {
                  pGVar12 = pGVar5;
                }
                bVar17 = pGVar16 == (Gia_Obj_t *)0x0;
                pGVar16 = pGVar12;
                if (bVar17) {
                  pGVar16 = pGVar5;
                }
              }
            }
          }
          else {
            pGVar16 = (Gia_Obj_t *)0x0;
            for (; (lVar14 < (p->pJust).iTail &&
                   (pGVar5 = (p->pJust).pData[lVar14], pGVar5 != (Gia_Obj_t *)0x0));
                lVar14 = lVar14 + 1) {
              if (pGVar16 < pGVar5) {
                pGVar16 = pGVar5;
              }
            }
          }
          if (pGVar16 == (Gia_Obj_t *)0x0) {
            pGVar16 = (Gia_Obj_t *)0x0;
          }
          else {
            iVar6 = Tas_VarIsJust(pGVar16);
            if (iVar6 == 0) {
              __assert_fail("Tas_VarIsJust( pVar )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                            ,0x52b,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
            }
            iVar6 = Gia_ObjRefNum(p->pAig,pGVar16 + -(*(ulong *)pGVar16 & 0x1fffffff));
            iVar7 = Gia_ObjRefNum(p->pAig,pGVar16 + -((ulong)*(uint *)&pGVar16->field_0x4 &
                                                     0x1fffffff));
            if (iVar7 < iVar6) {
              pGVar16 = (Gia_Obj_t *)
                        ((ulong)((uint)*(undefined8 *)pGVar16 >> 0x1d & 1) ^
                        (ulong)(pGVar16 + -(ulong)((uint)*(undefined8 *)pGVar16 & 0x1fffffff)));
            }
            else {
              pGVar16 = Gia_ObjChild1(pGVar16);
            }
            pGVar16 = (Gia_Obj_t *)((ulong)pGVar16 ^ 1);
          }
        }
        else {
          fVar18 = 0.0;
          pGVar16 = (Gia_Obj_t *)0x0;
          for (; (lVar14 < (p->pJust).iTail &&
                 (pGVar5 = (p->pJust).pData[lVar14], pGVar5 != (Gia_Obj_t *)0x0));
              lVar14 = lVar14 + 1) {
            if (((int)(uint)*(undefined8 *)pGVar5 < 0) ||
               (((uint)*(undefined8 *)pGVar5 & 0x1fffffff) == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                            ,0x1d5,"Gia_Obj_t *Tas_ManFindActive(Tas_Man_t *)");
            }
            iVar6 = Gia_ObjId(p->pAig,pGVar5);
            uVar8 = (uint)*(undefined8 *)pGVar5;
            fVar2 = p->pActivity[(int)(iVar6 - (uVar8 & 0x1fffffff))];
            if (pGVar16 == (Gia_Obj_t *)0x0) {
LAB_0054ae85:
              pGVar16 = pGVar5 + -(ulong)(uVar8 & 0x1fffffff);
              fVar18 = fVar2;
            }
            else if ((fVar18 < fVar2) ||
                    (((fVar2 == fVar18 && (!NAN(fVar2) && !NAN(fVar18))) &&
                     (pGVar16 < pGVar5 + -(ulong)(uVar8 & 0x1fffffff))))) goto LAB_0054ae85;
            uVar8 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20);
            fVar2 = p->pActivity[(int)(iVar6 - (uVar8 & 0x1fffffff))];
            if (fVar2 <= fVar18) {
              if (((fVar2 == fVar18) && (!NAN(fVar2) && !NAN(fVar18))) &&
                 (uVar11 = (ulong)(uVar8 & 0x1fffffff), pGVar16 < pGVar5 + -uVar11))
              goto LAB_0054aed8;
            }
            else {
              uVar11 = (ulong)(uVar8 & 0x1fffffff);
LAB_0054aed8:
              pGVar16 = pGVar5 + -uVar11;
              fVar18 = fVar2;
            }
          }
        }
        iVar13 = Level + 1;
        Tas_ManAssign(p,pGVar16,iVar13,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
        iVar7 = Tas_ManSolve_rec(p,iVar13);
        iVar6 = 0;
        if (iVar7 != 0) {
          lVar14 = (long)iVar7;
          pGVar5 = (p->pClauses).pData[lVar14];
          iVar6 = iVar7;
          if (pGVar5 == (Gia_Obj_t *)((ulong)pGVar16 & 0xfffffffffffffffe)) {
            Tas_ManCancelUntil(p,iVar9);
            (p->pJust).iHead = iVar3;
            (p->pJust).iTail = iVar4;
            Tas_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar16 ^ 1),iVar13,(Gia_Obj_t *)0x0,
                          (Gia_Obj_t *)0x0);
            iVar9 = Tas_ManSolve_rec(p,iVar13);
            iVar6 = 0;
            if (iVar9 != 0) {
              ppGVar10 = (p->pClauses).pData;
              lVar15 = (long)iVar9;
              iVar6 = iVar9;
              if (ppGVar10[lVar15] == pGVar5) {
                pGVar16 = ppGVar10[lVar14];
                if (pGVar16 == (Gia_Obj_t *)0x0) {
                  __assert_fail("pQue->pData[hClause0] != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                                ,0x36e,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
                }
                if (pGVar16 == pGVar5) {
                  if ((p->pClauses).iHead != (p->pClauses).iTail) {
                    __assert_fail("Tas_QueIsEmpty( pQue )",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                                  ,0x376,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
                  }
                  p_00 = &p->pClauses;
                  Tas_QuePush(p_00,(Gia_Obj_t *)0x0);
                  iVar6 = -1;
                  do {
                    ppGVar10 = (p->pClauses).pData;
                    do {
                      pGVar16 = ppGVar10[lVar14 + 1];
                      if (pGVar16 == (Gia_Obj_t *)0x0) {
                        while (pGVar16 = ppGVar10[lVar15 + 1], pGVar16 != (Gia_Obj_t *)0x0) {
                          lVar15 = lVar15 + 1;
                          if (-1 < (long)*(ulong *)pGVar16) {
                            *(ulong *)pGVar16 = *(ulong *)pGVar16 | 0x8000000000000000;
                            Tas_QuePush(p_00,pGVar16);
                            iVar9 = Tas_VarDecLevel(p,pGVar16);
                            if (iVar6 <= iVar9) {
                              iVar6 = iVar9;
                            }
                            ppGVar10 = (p->pClauses).pData;
                          }
                        }
                        lVar14 = (long)p_00->iHead;
                        while (lVar14 = lVar14 + 1, lVar14 < (p->pClauses).iTail) {
                          pGVar16 = (p->pClauses).pData[lVar14];
                          *(ulong *)pGVar16 = *(ulong *)pGVar16 & 0x7fffffffffffffff;
                        }
                        Tas_ManDeriveReason(p,iVar6);
                        iVar6 = Tas_QueFinish(p_00);
                        Tas_ManCreateCls(p,iVar6);
                        piVar1 = &(p->Pars).nBTThis;
                        *piVar1 = *piVar1 + 1;
                        return iVar6;
                      }
                      lVar14 = lVar14 + 1;
                    } while ((long)*(ulong *)pGVar16 < 0);
                    *(ulong *)pGVar16 = *(ulong *)pGVar16 | 0x8000000000000000;
                    Tas_QuePush(p_00,pGVar16);
                    iVar9 = Tas_VarDecLevel(p,pGVar16);
                    if (iVar6 <= iVar9) {
                      iVar6 = iVar9;
                    }
                  } while( true );
                }
                __assert_fail("pQue->pData[hClause0] == pQue->pData[hClause1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                              ,0x36f,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
              }
            }
          }
        }
      }
    }
  }
  else {
    Tas_ManCreateCls(p,iVar6);
  }
  return iVar6;
}

Assistant:

int Tas_ManSolve_rec( Tas_Man_t * p, int Level )
{ 
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pVar, * pDecVar = NULL;
    int hClause, hLearn0, hLearn1;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Tas_QueIsEmpty(&p->pProp) );
    if ( (hClause = Tas_ManPropagate( p, Level )) )
    {
        Tas_ManCreateCls( p, hClause );
        return hClause;
    }
    // check for satisfying assignment
    assert( Tas_QueIsEmpty(&p->pProp) );
    if ( Tas_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Tas_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Tas_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseActive )
        pVar = NULL, pDecVar = Tas_ManFindActive( p );
    else if ( p->Pars.fUseHighest )
//        pVar = NULL, pDecVar = Tas_ManDecideHighestFanin( p );
        pVar = Tas_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Tas_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Tas_ManDecideMaxFF( p );
    else assert( 0 );
    // chose decision variable using fanout count
    if ( pVar != NULL )
    {
        assert( Tas_VarIsJust( pVar ) );
        if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
            pDecVar = Gia_Not(Gia_ObjChild0(pVar));
        else
            pDecVar = Gia_Not(Gia_ObjChild1(pVar));
//        pDecVar = Gia_NotCond( pDecVar, Gia_Regular(pDecVar)->fMark1 ^ !Gia_IsComplement(pDecVar) );
    }
    // decide on first fanin
    Tas_ManAssign( p, pDecVar, Level+1, NULL, NULL );
    if ( !(hLearn0 = Tas_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0] != Gia_Regular(pDecVar) )
        return hLearn0;
    Tas_ManCancelUntil( p, iPropHead );
    Tas_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Tas_ManAssign( p, Gia_Not(pDecVar), Level+1, NULL, NULL );
    if ( !(hLearn1 = Tas_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1] != Gia_Regular(pDecVar) )
        return hLearn1;
    hClause = Tas_ManResolve( p, Level, hLearn0, hLearn1 );
    Tas_ManCreateCls( p, hClause );
//    Tas_ManPrintClauseNew( p, Level, hClause );
//    if ( Level > Tas_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}